

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O3

void __thiscall kj::parse::anon_unknown_0::TestCase189::run(TestCase189 *this)

{
  Maybe<int> result;
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_> parser;
  Input input;
  int local_54;
  AddFailureAdapter local_50;
  undefined1 local_34 [36];
  
  local_34[2] = 0;
  local_34._0_2_ = 0x6f66;
  local_34._4_8_ = 0;
  local_34._12_8_ = "foooob";
  local_34._20_8_ = "oob";
  local_34._28_8_ = "foooob";
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>::
  parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>
              *)&local_50,(IteratorInput<char,_const_char_*> *)local_34);
  if (local_50.handled == true) {
    local_54 = local_50._4_4_;
    if ((local_50._4_4_ != 2) && (kj::_::Debug::minSeverity < 3)) {
      local_50.handled = true;
      local_50._1_3_ = 0;
      kj::_::Debug::log<char_const(&)[29],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xc6,ERROR,"\"failed: expected \" \"(2) == (*i)\", 2, *i",
                 (char (*) [29])"failed: expected (2) == (*i)",(int *)&local_50,&local_54);
    }
  }
  else {
    local_50.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_50.line = 200;
    local_50.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[22]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,200,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [22])"Expected 2, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_50);
  }
  if ((local_34._12_8_ != local_34._20_8_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0xca,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if (local_34._4_8_ != 0) {
    if ((ulong)local_34._28_8_ < (ulong)local_34._12_8_) {
      local_34._28_8_ = local_34._12_8_;
    }
    if ((ulong)local_34._28_8_ <= *(char **)(local_34._4_8_ + 0x18)) {
      local_34._28_8_ = *(char **)(local_34._4_8_ + 0x18);
    }
    *(undefined8 *)(local_34._4_8_ + 0x18) = local_34._28_8_;
  }
  local_34._4_8_ = 0;
  local_34._12_8_ = "foooob";
  local_34._20_8_ = "b";
  local_34._28_8_ = "foooob";
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>::
  parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>
              *)&local_50,(IteratorInput<char,_const_char_*> *)local_34);
  if (local_50.handled == true) {
    local_54 = local_50._4_4_;
    if ((local_50._4_4_ != 4) && (kj::_::Debug::minSeverity < 3)) {
      local_50.handled = true;
      local_50._1_3_ = 0;
      kj::_::Debug::log<char_const(&)[29],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xd1,ERROR,"\"failed: expected \" \"(4) == (*i)\", 4, *i",
                 (char (*) [29])"failed: expected (4) == (*i)",(int *)&local_50,&local_54);
    }
  }
  else {
    local_50.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_50.line = 0xd3;
    local_50.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[22]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0xd3,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [22])"Expected 4, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_50);
  }
  if ((local_34._12_8_ != local_34._20_8_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0xd5,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if (local_34._4_8_ != 0) {
    if ((ulong)local_34._28_8_ < (ulong)local_34._12_8_) {
      local_34._28_8_ = local_34._12_8_;
    }
    if ((ulong)local_34._28_8_ <= *(char **)(local_34._4_8_ + 0x18)) {
      local_34._28_8_ = *(char **)(local_34._4_8_ + 0x18);
    }
    *(undefined8 *)(local_34._4_8_ + 0x18) = local_34._28_8_;
  }
  local_34._4_8_ = 0;
  local_34._12_8_ = "foooob";
  local_34._20_8_ = "";
  local_34._28_8_ = "foooob";
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>::
  parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>
              *)&local_50,(IteratorInput<char,_const_char_*> *)local_34);
  if (local_50.handled == true) {
    local_54 = local_50._4_4_;
    if ((local_50._4_4_ != 4) && (kj::_::Debug::minSeverity < 3)) {
      local_50.handled = true;
      local_50._1_3_ = 0;
      kj::_::Debug::log<char_const(&)[29],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xdc,ERROR,"\"failed: expected \" \"(4) == (*i)\", 4, *i",
                 (char (*) [29])"failed: expected (4) == (*i)",(int *)&local_50,&local_54);
    }
  }
  else {
    local_50.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_50.line = 0xde;
    local_50.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[22]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0xde,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [22])"Expected 4, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_50);
  }
  if ((local_34._12_8_ == local_34._20_8_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0xe0,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
               (char (*) [34])"failed: expected !(input.atEnd())");
  }
  if (local_34._4_8_ != 0) {
    if ((ulong)local_34._28_8_ < (ulong)local_34._12_8_) {
      local_34._28_8_ = local_34._12_8_;
    }
    if ((ulong)local_34._28_8_ <= *(char **)(local_34._4_8_ + 0x18)) {
      local_34._28_8_ = *(char **)(local_34._4_8_ + 0x18);
    }
    *(undefined8 *)(local_34._4_8_ + 0x18) = local_34._28_8_;
  }
  return;
}

Assistant:

TEST(CommonParsers, ManyParserCountOnly) {
  StringPtr text = "foooob";

  auto parser = sequence(exactly('f'), many(exactly('o')));

  {
    Input input(text.begin(), text.begin() + 3);
    Maybe<int> result = parser(input);
    KJ_IF_MAYBE(i, result) {
      EXPECT_EQ(2, *i);
    } else {
      ADD_FAILURE() << "Expected 2, got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }